

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v_basic.c
# Opt level: O0

_Bool mptest_swap_rows(int nrow,int ncol,m256v *Ml,m2v *Ms)

{
  undefined8 in_RCX;
  m2v *in_RDX;
  int r2;
  int r1;
  int i;
  undefined4 local_1c;
  
  for (local_1c = 0; local_1c < 10; local_1c = local_1c + 1) {
    rand();
    rand();
    m256v_swap_rows((m256v *)in_RDX,(int)((ulong)in_RCX >> 0x20),(int)in_RCX);
    m2v_swap_rows(in_RDX,(int)((ulong)in_RCX >> 0x20),(int)in_RCX);
  }
  return true;
}

Assistant:

static bool mptest_swap_rows(int nrow, int ncol, m256v* Ml, m2v* Ms)
{
	for (int i = 0; i < 10; ++i) {
		const int r1 = rand() % nrow;
		const int r2 = rand() % nrow;

		m256v_swap_rows(Ml, r1, r2);
		m2v_swap_rows(Ms, r1, r2);
	}
	return true;
}